

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManUpdateFrontier(Cbs2_Man_t *p,int iPropHeadOld,int *piDecLit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  bool bVar7;
  int local_34;
  int iJustTailOld;
  int iLit;
  int iVar;
  int i;
  abctime clk;
  int *piDecLit_local;
  int iPropHeadOld_local;
  Cbs2_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  iVar3 = (p->pJust).iTail;
  *piDecLit = -1;
  iVar1 = Cbs2_QueIsEmpty(&p->pProp);
  if (iVar1 != 0) {
    iLit = (p->pJust).iHead;
    while( true ) {
      bVar7 = false;
      if (iLit < (p->pJust).iTail) {
        iJustTailOld = (p->pJust).pData[iLit];
        bVar7 = iJustTailOld != 0;
      }
      if ((!bVar7) || (iLit == iVar3)) break;
      pGVar5 = Gia_ManObj(p->pAig,iJustTailOld);
      iVar1 = Cbs2_VarIsJust(p,pGVar5,iJustTailOld);
      if (iVar1 != 0) {
        Cbs2_QuePush(&p->pJust,iJustTailOld);
      }
      iLit = iLit + 1;
    }
    (p->pProp).iHead = iPropHeadOld;
    iLit = (p->pProp).iHead;
    while( true ) {
      bVar7 = false;
      if (iLit < (p->pProp).iTail) {
        local_34 = (p->pProp).pData[iLit];
        bVar7 = local_34 != 0;
      }
      if (!bVar7) break;
      iVar1 = Abc_Lit2Var(local_34);
      pGVar5 = Gia_ManObj(p->pAig,iVar1);
      iVar2 = Cbs2_VarIsJust(p,pGVar5,iVar1);
      if (iVar2 != 0) {
        Cbs2_QuePush(&p->pJust,iVar1);
      }
      iLit = iLit + 1;
    }
    (p->pProp).iHead = (p->pProp).iTail;
    (p->pJust).iHead = iVar3;
    aVar6 = Abc_Clock();
    p->timeJFront = (aVar6 - aVar4) + p->timeJFront;
    iVar3 = Cbs2_QueIsEmpty(&p->pJust);
    return iVar3;
  }
  __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                ,0x4bb,"int Cbs2_ManUpdateFrontier(Cbs2_Man_t *, int, int *)");
}

Assistant:

int Cbs2_ManUpdateFrontier( Cbs2_Man_t * p, int iPropHeadOld, int * piDecLit )
{
    abctime clk = Abc_Clock();
    int i, iVar, iLit, iJustTailOld = p->pJust.iTail;
    *piDecLit = -1;
    assert( Cbs2_QueIsEmpty(&p->pProp) );
    // visit old frontier nodes
    Cbs2_QueForEachEntry( p->pJust, iVar, i )
        if ( i == iJustTailOld )
            break;
        else if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    // append new nodes
    p->pProp.iHead = iPropHeadOld;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        iVar = Abc_Lit2Var(iLit);
        if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    }
    p->pProp.iHead = p->pProp.iTail;
    // update the head of the frontier
    p->pJust.iHead = iJustTailOld;
    // return 1 if the queue is empty
    p->timeJFront += Abc_Clock() - clk;
//printf( "%d ", p->pJust.iTail - p->pJust.iHead );
    return Cbs2_QueIsEmpty(&p->pJust);
}